

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::upperword(Forth *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  byte bVar3;
  byte __c;
  uint uVar4;
  Cell CVar5;
  Cell CVar6;
  int iVar7;
  ulong uVar8;
  CAddr Value;
  string wordBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ForthStack<unsigned_int> *local_58;
  string local_50;
  
  requireDStackDepth(this,1,"UPPERWORD");
  local_58 = &this->dStack;
  uVar4 = ForthStack<unsigned_int>::getTop(local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_78,'\0');
  CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if (0 < (int)(CVar5 - CVar6)) {
    CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
    CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    bVar3 = dataSpaceAt(this,CVar6 + CVar5);
    while( true ) {
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if ((int)(CVar5 - CVar6) < 1) break;
      if ((int)(char)uVar4 != (uint)bVar3) {
        if ((uVar4 & 0xff) != 0x20) break;
        iVar7 = isspace((uint)bVar3);
        if (iVar7 == 0) break;
      }
      incSourceBufferOffset(this);
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      bVar3 = dataSpaceAt(this,CVar6 + CVar5);
    }
  }
  CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if (0 < (int)(CVar5 - CVar6)) {
    while( true ) {
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if ((int)(CVar5 - CVar6) < 1) break;
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      bVar3 = dataSpaceAt(this,CVar6 + CVar5);
      if ((int)(char)uVar4 == (uint)bVar3) break;
      if ((uVar4 & 0xff) == 0x20) {
        iVar7 = isspace((uint)bVar3);
        if (iVar7 != 0) break;
      }
      __c = bVar3 - 0x20;
      if (0x19 < (byte)(bVar3 + 0x9f)) {
        __c = bVar3;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_78,__c);
      incSourceBufferOffset(this);
    }
    CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
    CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    if (0 < (int)(CVar5 - CVar6)) {
      incSourceBufferOffset(this);
    }
  }
  sVar2 = local_78._M_string_length;
  _Var1._M_p = local_78._M_dataplus._M_p;
  if (local_78._M_string_length < 0x100) {
    *local_78._M_dataplus._M_p = (char)local_78._M_string_length + -1;
    Value = this->VarOffsetWordBuffer;
    if (local_78._M_string_length != 0) {
      uVar8 = 0;
      do {
        dataSpaceSet(this,Value + (int)uVar8,_Var1._M_p[uVar8]);
        uVar8 = uVar8 + 1;
      } while (sVar2 != uVar8);
      Value = this->VarOffsetWordBuffer;
    }
    ForthStack<unsigned_int>::setTop(local_58,Value);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"WORD: very long word ","");
    throwMessage(this,&local_50,errorParsedStringOverflow);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void  upperword() {
			REQUIRE_DSTACK_DEPTH(1, "UPPERWORD");
			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/

			std::string wordBuffer{};
			wordBuffer.push_back(0);  // First char of buffer is length.
			
				// Skip leading delimiters
				if (getSourceBufferRemain() > 0) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					while (getSourceBufferRemain() > 0 && ((currentChar == delim)
						|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
						)) {
						incSourceBufferOffset();
						currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					}
				}
				if (getSourceBufferRemain() > 0) {
					// Copy characters until we see the delimiter again.
					while (getSourceBufferRemain() >0 ) {
						auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
						if( currentChar != delim
						&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
						) {
						wordBuffer.push_back(toupper_ascii(static_cast<unsigned char>(currentChar)));
						incSourceBufferOffset();
						} else {
							break;
						}
					}
					// source point to the delimiter char, skip it.
					if (getSourceBufferRemain() >0 ) {
						incSourceBufferOffset(); 
					}
				}
				if (wordBuffer.size() > 255){
					// @bug it is catched below
					throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
					return;
				}
				// Update the count at the beginning of the buffer.
				wordBuffer[0] = static_cast<char>(wordBuffer.size() - 1);
				// copy to fixed buffer
				moveIntoDataSpace(VarOffsetWordBuffer, wordBuffer.c_str(), wordBuffer.size());
				dStack.setTop(CELL(VarOffsetWordBuffer));
		}